

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

int __thiscall glcts::SamplerLayoutBindingCase::maxBindings(SamplerLayoutBindingCase *this)

{
  Functions *pFVar1;
  GLint local_14;
  SamplerLayoutBindingCase *pSStack_10;
  int units;
  SamplerLayoutBindingCase *this_local;
  
  local_14 = 0;
  pSStack_10 = this;
  pFVar1 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
  (*pFVar1->getIntegerv)(0x8b4d,&local_14);
  return local_14;
}

Assistant:

virtual int maxBindings()
	{
		int units = 0;
		gl().getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &units);
		return units;
	}